

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::FocusFrontMostActiveWindow(ImGuiWindow *ignore_window)

{
  ImGuiWindow *pIVar1;
  long lVar2;
  ulong uVar3;
  ImGuiWindow *window;
  
  lVar2 = (long)(GImGui->Windows).Size;
  if (0 < lVar2) {
    uVar3 = lVar2 + 1;
    do {
      pIVar1 = (GImGui->Windows).Data[uVar3 - 2];
      if (((pIVar1 != ignore_window) && (pIVar1->WasActive == true)) &&
         ((pIVar1->Flags & 0x1000000) == 0)) {
        window = pIVar1->NavLastChildNavWindow;
        if (pIVar1->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
          window = pIVar1;
        }
        FocusWindow(window);
        return;
      }
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  return;
}

Assistant:

void ImGui::FocusFrontMostActiveWindow(ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;
    for (int i = g.Windows.Size - 1; i >= 0; i--)
        if (g.Windows[i] != ignore_window && g.Windows[i]->WasActive && !(g.Windows[i]->Flags & ImGuiWindowFlags_ChildWindow))
        {
            ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(g.Windows[i]); 
            FocusWindow(focus_window);
            return;
        }
}